

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong size;
  int iVar6;
  parasail_result_t *ppVar7;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong size_00;
  int iVar14;
  char *__format;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint local_f4;
  int local_b8;
  int local_b4;
  int local_b0;
  int NWL;
  int NWS;
  int NWM;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "_s2";
LAB_004f0e38:
    fprintf(_stderr,__format,"parasail_nw_stats",pcVar10);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar10 = "s2Len";
    goto LAB_004f0e38;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar10 = "open";
    goto LAB_004f0e38;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar10 = "gap";
    goto LAB_004f0e38;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "matrix";
    goto LAB_004f0e38;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_nw_stats");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar10 = "_s1";
      goto LAB_004f0e38;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar10 = "_s1Len";
      goto LAB_004f0e38;
    }
    local_f4 = _s1Len;
    if (matrix->type == 0) goto LAB_004f075b;
  }
  local_f4 = matrix->length;
LAB_004f075b:
  ppVar7 = parasail_result_new_stats();
  if (ppVar7 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar7->flag = ppVar7->flag | 0x1410101;
  ptr = parasail_memalign_int(0x10,(long)(int)local_f4);
  size = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,size);
  size_00 = (ulong)(s2Len + 1);
  ptr_01 = parasail_memalign_int(0x10,size_00);
  ptr_02 = parasail_memalign_int(0x10,size_00);
  ptr_03 = parasail_memalign_int(0x10,size_00);
  ptr_04 = parasail_memalign_int(0x10,size_00);
  ptr_05 = parasail_memalign_int(0x10,size_00);
  ptr_06 = parasail_memalign_int(0x10,size_00);
  ptr_07 = parasail_memalign_int(0x10,size_00);
  ptr_08 = parasail_memalign_int(0x10,size_00);
  auVar24._0_4_ = -(uint)((int)ptr == 0);
  auVar24._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar24._8_4_ = -(uint)((int)ptr_00 == 0);
  auVar24._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar29._4_4_ = auVar24._0_4_;
  auVar29._0_4_ = auVar24._4_4_;
  auVar29._8_4_ = auVar24._12_4_;
  auVar29._12_4_ = auVar24._8_4_;
  auVar25._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar25._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar25._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar25._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar30._4_4_ = auVar25._0_4_;
  auVar30._0_4_ = auVar25._4_4_;
  auVar30._8_4_ = auVar25._12_4_;
  auVar30._12_4_ = auVar25._8_4_;
  auVar30 = packssdw(auVar29 & auVar24,auVar30 & auVar25);
  auVar27._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar27._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar27._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar27._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar23._4_4_ = auVar27._0_4_;
  auVar23._0_4_ = auVar27._4_4_;
  auVar23._8_4_ = auVar27._12_4_;
  auVar23._12_4_ = auVar27._8_4_;
  auVar28._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar28._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar28._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar28._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar26._4_4_ = auVar28._0_4_;
  auVar26._0_4_ = auVar28._4_4_;
  auVar26._8_4_ = auVar28._12_4_;
  auVar26._12_4_ = auVar28._8_4_;
  auVar24 = packssdw(auVar23 & auVar27,auVar26 & auVar28);
  auVar24 = packssdw(auVar30,auVar24);
  uVar8 = 0;
  if ((ptr_08 == (int *)0x0 || ptr_07 == (int *)0x0) ||
      ((((((((auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar24 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar24 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0'))
  {
    return (parasail_result_t *)0x0;
  }
  uVar16 = 0;
  if (0 < (int)local_f4) {
    uVar16 = (ulong)local_f4;
  }
  for (; uVar16 != uVar8; uVar8 = uVar8 + 1) {
    ptr[uVar8] = matrix->mapper[(byte)_s1[uVar8]];
  }
  piVar5 = matrix->mapper;
  for (uVar8 = 0; size != uVar8; uVar8 = uVar8 + 1) {
    ptr_00[uVar8] = piVar5[(byte)_s2[uVar8]];
  }
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_05 = -0x40000000;
  *ptr_06 = 0;
  *ptr_07 = 0;
  *ptr_08 = 0;
  iVar6 = -open;
  for (uVar8 = 1; size_00 != uVar8; uVar8 = uVar8 + 1) {
    ptr_01[uVar8] = iVar6;
    ptr_02[uVar8] = 0;
    ptr_03[uVar8] = 0;
    ptr_04[uVar8] = 0;
    ptr_05[uVar8] = -0x40000000;
    ptr_06[uVar8] = 0;
    ptr_07[uVar8] = 0;
    ptr_08[uVar8] = 0;
    iVar6 = iVar6 - gap;
  }
  for (uVar8 = 1; uVar8 != (int)uVar16 + 1; uVar8 = uVar8 + 1) {
    if (matrix->type == 0) {
      lVar9 = (long)ptr[uVar8 - 1];
    }
    else {
      lVar9 = uVar8 - 1;
    }
    lVar9 = matrix->size * lVar9;
    piVar5 = matrix->matrix;
    iVar6 = *ptr_01;
    NWM = *ptr_02;
    NWS = *ptr_03;
    NWL = *ptr_04;
    iVar18 = -((int)(uVar8 - 1) * gap + open);
    *ptr_01 = iVar18;
    *ptr_02 = 0;
    *ptr_03 = 0;
    *ptr_04 = 0;
    iVar22 = -0x40000000;
    iVar13 = 0;
    iVar14 = 0;
    iVar21 = 0;
    local_b4 = 0;
    local_b0 = 0;
    local_b8 = 0;
    for (lVar17 = 0; size_00 - 1 != lVar17; lVar17 = lVar17 + 1) {
      iVar1 = ptr_01[lVar17 + 1];
      iVar2 = ptr_02[lVar17 + 1];
      iVar3 = ptr_03[lVar17 + 1];
      iVar11 = iVar1 - open;
      iVar20 = ptr_05[lVar17 + 1] - gap;
      iVar12 = iVar20;
      if (iVar20 < iVar11) {
        iVar12 = iVar11;
      }
      iVar4 = ptr_04[lVar17 + 1];
      ptr_05[lVar17 + 1] = iVar12;
      iVar19 = iVar18 - open;
      iVar15 = iVar22 - gap;
      iVar22 = iVar19;
      if (iVar19 <= iVar15) {
        iVar22 = iVar15;
      }
      iVar6 = iVar6 + piVar5[lVar9 + ptr_00[lVar17]];
      iVar18 = iVar22;
      if (iVar22 < iVar6) {
        iVar18 = iVar6;
      }
      if (iVar18 <= iVar12) {
        iVar18 = iVar12;
      }
      if (iVar20 < iVar11) {
        ptr_06[lVar17 + 1] = iVar2;
        ptr_07[lVar17 + 1] = iVar3;
        iVar12 = iVar4;
      }
      else {
        iVar12 = ptr_08[lVar17 + 1];
      }
      ptr_08[lVar17 + 1] = iVar12 + 1;
      iVar11 = iVar14;
      iVar20 = iVar13;
      if (iVar19 <= iVar15) {
        iVar11 = local_b0;
        iVar21 = local_b8;
        iVar20 = local_b4;
      }
      local_b8 = iVar21 + 1;
      if (iVar18 == iVar6) {
        iVar14 = NWS + (uint)(0 < piVar5[lVar9 + ptr_00[lVar17]]);
        iVar21 = NWL + 1;
        iVar13 = NWM + (uint)(ptr[uVar8 - 1] == ptr_00[lVar17]);
      }
      else {
        iVar14 = iVar11;
        iVar21 = local_b8;
        iVar13 = iVar20;
        if (iVar18 == ptr_05[lVar17 + 1]) {
          iVar13 = ptr_06[lVar17 + 1];
          iVar14 = ptr_07[lVar17 + 1];
          iVar21 = iVar12 + 1;
        }
      }
      ptr_01[lVar17 + 1] = iVar18;
      ptr_02[lVar17 + 1] = iVar13;
      ptr_03[lVar17 + 1] = iVar14;
      ptr_04[lVar17 + 1] = iVar21;
      iVar6 = iVar1;
      local_b4 = iVar20;
      local_b0 = iVar11;
      NWL = iVar4;
      NWS = iVar3;
      NWM = iVar2;
    }
  }
  ppVar7->score = ptr_01[size];
  ppVar7->end_query = local_f4 - 1;
  ppVar7->end_ref = s2Len + -1;
  ((ppVar7->field_4).stats)->matches = ptr_02[size];
  ((ppVar7->field_4).stats)->similar = ptr_03[size];
  ((ppVar7->field_4).stats)->length = ptr_04[size];
  parasail_free(ptr_08);
  parasail_free(ptr_07);
  parasail_free(ptr_06);
  parasail_free(ptr_05);
  parasail_free(ptr_04);
  parasail_free(ptr_03);
  parasail_free(ptr_02);
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar7;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open - (j-1)*gap;
        HM[j] = 0;
        HS[j] = 0;
        HL[j] = 0;
        F[j] = NEG_INF_32;
        FM[j] = 0;
        FS[j] = 0;
        FL[j] = 0;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = -open - (i-1)*gap;
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int H_new;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext  = F[j] - gap;
            F[j]  = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            H_new = MAX(H_dag, E);
            H_new = MAX(H_new, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            WH = H_new;
            if (H_new == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (H_new == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s2Len];
    result->stats->similar = HS[s2Len];
    result->stats->length = HL[s2Len];

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}